

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TryCatchStatement.h
# Opt level: O2

void __thiscall TryCatchStatement::execute(TryCatchStatement *this,Environment *env)

{
  element_type *peVar1;
  Environment local;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  Environment::Environment((Environment *)&local_58,env);
  peVar1 = (this->tryBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar1->super_Statement)._vptr_Statement)(peVar1,&local_58);
  std::
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_58);
  return;
}

Assistant:

void execute(Environment *env) override {
        try {
            Environment local = *env;
            tryBlock -> execute(&local);
        } catch(ThrowPacket& throwPacket) {
            Environment local = *env;
            if(!ident.empty())
                local.putValue(ident, Scope::Public, throwPacket.getValue(), false);
            catchBlock -> execute(&local);
        }
    }